

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlep_router_interface.c
# Opt level: O2

dlep_router_if * dlep_router_add_interface(char *ifname)

{
  int iVar1;
  dlep_router_if *interf;
  char *format;
  
  interf = dlep_router_get_by_layer2_if(ifname);
  if (interf == (dlep_router_if *)0x0) {
    interf = (dlep_router_if *)oonf_class_malloc(&_router_if_class);
    if (interf != (dlep_router_if *)0x0) {
      iVar1 = dlep_if_add((dlep_if *)interf,ifname,&_l2_origin,&_l2_default_origin,
                          _connect_to_if_changed,LOG_DLEP_ROUTER,false);
      if (iVar1 == 0) {
        (interf->_connect_to_watchdog).class = &_connect_to_watchdog_class;
        if ((log_global_mask[LOG_DLEP_ROUTER] & 1) == 0) {
          return interf;
        }
        format = "Add session %s";
        iVar1 = 0xd5;
        goto LAB_00141666;
      }
      oonf_class_free(&_router_if_class,interf);
    }
    interf = (dlep_router_if *)0x0;
  }
  else {
    if ((log_global_mask[LOG_DLEP_ROUTER] & 1) == 0) {
      return interf;
    }
    format = "use existing instance for %s";
    iVar1 = 0xc4;
LAB_00141666:
    oonf_log(LOG_SEVERITY_DEBUG,LOG_DLEP_ROUTER,"src/generic/dlep/router/dlep_router_interface.c",
             iVar1,(void *)0x0,0,format,ifname);
  }
  return interf;
}

Assistant:

struct dlep_router_if *
dlep_router_add_interface(const char *ifname) {
  struct dlep_router_if *interface;

  interface = dlep_router_get_by_layer2_if(ifname);
  if (interface) {
    OONF_DEBUG(LOG_DLEP_ROUTER, "use existing instance for %s", ifname);
    return interface;
  }

  interface = oonf_class_malloc(&_router_if_class);
  if (!interface) {
    return NULL;
  }

  if (dlep_if_add(&interface->interf, ifname, &_l2_origin, &_l2_default_origin, _connect_to_if_changed, LOG_DLEP_ROUTER, false)) {
    oonf_class_free(&_router_if_class, interface);
    return NULL;
  }

  /* prepare timer */
  interface->_connect_to_watchdog.class = &_connect_to_watchdog_class;

  OONF_DEBUG(LOG_DLEP_ROUTER, "Add session %s", ifname);
  return interface;
}